

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_file_system.cxx
# Opt level: O2

path_alias * __thiscall
xray_re::xr_file_system::add_path_alias(xr_file_system *this,string *path,string *root,string *add)

{
  path_alias *ppVar1;
  path_alias *new_pa;
  
  ppVar1 = find_path_alias(this,(path->_M_dataplus)._M_p);
  if (ppVar1 == (path_alias *)0x0) {
    ppVar1 = (path_alias *)operator_new(0x80);
    path_alias::path_alias(ppVar1);
    new_pa = ppVar1;
    std::
    vector<xray_re::xr_file_system::path_alias_*,_std::allocator<xray_re::xr_file_system::path_alias_*>_>
    ::push_back(&this->m_aliases,&new_pa);
    std::__cxx11::string::_M_assign((string *)new_pa);
    ppVar1 = find_path_alias(this,(root->_M_dataplus)._M_p);
    if (ppVar1 == (path_alias *)0x0) {
      std::__cxx11::string::_M_assign((string *)&new_pa->root);
      append_path_separator(&new_pa->root);
    }
    else {
      std::__cxx11::string::_M_assign((string *)&new_pa->root);
    }
    std::__cxx11::string::append((string *)&new_pa->root);
    append_path_separator(&new_pa->root);
    return new_pa;
  }
  __assert_fail("pa == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/xray_re/xr_file_system.cxx"
                ,0x3a,
                "xr_file_system::path_alias *xray_re::xr_file_system::add_path_alias(const std::string &, const std::string &, const std::string &)"
               );
}

Assistant:

xr_file_system::path_alias* xr_file_system::add_path_alias(const std::string& path,
		const std::string& root, const std::string& add)
{
	const path_alias* pa = find_path_alias(path.c_str());
	assert(pa == 0);
	if (pa != 0)
		return 0;

	path_alias* new_pa = new path_alias;
	m_aliases.push_back(new_pa);
	new_pa->path = path;
	pa = find_path_alias(root.c_str());
	if (pa) {
		new_pa->root = pa->root;
	} else {
		new_pa->root = root;
		append_path_separator(new_pa->root);
	}
	new_pa->root += add;
	append_path_separator(new_pa->root);
	return new_pa;
}